

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

bool __thiscall
r_comp::Compiler::read_number
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  uint uVar1;
  element_type *peVar2;
  undefined2 uVar3;
  undefined1 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  Atom *this_00;
  uint16_t *extent_index_00;
  undefined7 in_register_00000011;
  double num;
  istringstream stream;
  Atom local_2dc [4];
  double local_2d8;
  undefined4 local_2cc;
  uint16_t *local_2c8;
  Ptr local_2c0;
  Ptr local_2b0;
  Ptr local_2a0;
  Ptr local_290;
  Ptr local_280;
  Ptr local_270;
  Ptr local_260;
  Ptr local_250;
  locale local_240 [8];
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  undefined1 *local_218;
  ulong local_210;
  undefined1 local_208 [16];
  Class local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_250.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_250.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_250.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    p = (Class *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_250.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_250.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_250.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_250.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_2c8 = extent_index;
  bVar5 = read_nil_nb(this,&local_250,write_index,(uint16_t *)p,write);
  local_2cc = (undefined4)CONCAT71(in_register_00000011,enforce);
  if (local_250.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_250.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  bVar6 = true;
  if (!bVar5) {
    local_260.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_260.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
    if (local_260.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      p = (Class *)&__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_260.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_260.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_260.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_260.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    bVar5 = read_forever_nb(this,&local_260,write_index,(uint16_t *)p,write);
    if (local_260.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_260.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (!bVar5) {
      local_270.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_270.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
      if (local_270.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p = (Class *)&__libc_single_threaded;
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_270.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (local_270.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_270.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (local_270.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      Class::Class(&local_1f8,NUMBER);
      bVar5 = read_variable(this,&local_270,write_index,(uint16_t *)p,write,&local_1f8);
      std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
                (&local_1f8.things_to_read);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.str_opcode._M_dataplus._M_p != &local_1f8.str_opcode.field_2) {
        operator_delete(local_1f8.str_opcode._M_dataplus._M_p);
      }
      r_code::Atom::~Atom(&local_1f8.atom);
      bVar6 = true;
      if (local_270.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_270.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (!bVar5) {
        local_280.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_280.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_280.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_280.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_280.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_280.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_280.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        extent_index_00 = local_2c8;
        bVar5 = read_reference(this,&local_280,write_index,local_2c8,write,NUMBER);
        if (local_280.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_280.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (!bVar5) {
          local_290.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_290.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
          if (local_290.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            extent_index_00 = (uint16_t *)&__libc_single_threaded;
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_290.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_290.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_290.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_290.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          bVar5 = read_wildcard(this,&local_290,write_index,extent_index_00,write);
          if (local_290.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_290.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (!bVar5) {
            local_2a0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_2a0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
            if (local_2a0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              extent_index_00 = (uint16_t *)&__libc_single_threaded;
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_2a0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_2a0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_2a0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_2a0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            bVar5 = read_tail_wildcard(this,&local_2a0,write_index,extent_index_00,write);
            if (local_2a0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_2a0.
                         super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (!bVar5) {
              iVar7 = std::__cxx11::string::compare
                                ((char *)&((node->
                                           super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr)->cmd);
              if (iVar7 == 0) {
                bVar5 = false;
                bVar6 = false;
              }
              else {
                peVar2 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr;
                local_238[0] = local_228;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"0x","");
                bVar5 = false;
                lVar8 = std::__cxx11::string::find((char *)&peVar2->cmd,(ulong)local_238[0],0);
                if (lVar8 == 0) {
                  bVar6 = false;
                }
                else {
                  peVar2 = (node->
                           super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr;
                  local_218 = local_208;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"us","");
                  bVar5 = true;
                  if ((peVar2->cmd)._M_string_length < local_210) {
                    bVar6 = true;
                  }
                  else {
                    lVar8 = std::__cxx11::string::rfind
                                      ((char *)&peVar2->cmd,(ulong)local_218,0xffffffffffffffff);
                    bVar6 = lVar8 != (peVar2->cmd)._M_string_length - local_210;
                  }
                }
              }
              if ((bVar5) && (local_218 != local_208)) {
                operator_delete(local_218);
              }
              if ((iVar7 != 0) && (local_238[0] != local_228)) {
                operator_delete(local_238[0]);
              }
              if (bVar6) {
                std::__cxx11::istringstream::istringstream
                          ((istringstream *)&local_1b0,
                           (string *)
                           &((node->
                             super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->cmd,_S_in);
                std::locale::locale((locale *)&local_2d8,"C");
                std::ios::imbue(local_240);
                std::locale::~locale(local_240);
                std::locale::~locale((locale *)&local_2d8);
                std::istream::_M_extract<double>((double *)&local_1b0);
                uVar1 = *(uint *)((long)auStack_190 + *(long *)(local_1b0._M_dataplus._M_p + -0x18))
                ;
                if (write && (uVar1 & 5) == 0) {
                  r_code::Atom::Float((float)local_2d8);
                  this_00 = r_code::vector<r_code::Atom>::operator[]
                                      ((vector<r_code::Atom> *)(this->current_object + 8),
                                       (ulong)write_index);
                  r_code::Atom::operator=(this_00,local_2dc);
                  r_code::Atom::~Atom(local_2dc);
                }
                std::__cxx11::istringstream::~istringstream((istringstream *)&local_1b0);
                std::ios_base::~ios_base(local_138);
                if ((uVar1 & 5) == 0) {
                  return true;
                }
              }
              uVar3 = (this->state).pattern_lvl;
              uVar4 = (this->state).no_arity_check;
              local_2b0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
              local_2b0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if (local_2b0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_2b0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_2b0.
                        super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_2b0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_2b0.
                        super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              bVar6 = expression(this,&local_2b0,NUMBER,write_index,local_2c8,write);
              if (local_2b0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_2b0.
                           super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (!bVar6) {
                (this->state).pattern_lvl = uVar3;
                (this->state).no_arity_check = (bool)uVar4;
                if ((char)local_2cc != '\0') {
                  std::operator+(&local_1b0,
                                 " error: expected a number or an expr evaluating to a number, got: "
                                 ,&((node->
                                    super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->cmd);
                  local_2c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (node->
                           super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr;
                  local_2c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi =
                       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
                  if (local_2c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_2c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_2c0.
                            super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_2c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi)->_M_use_count =
                           (local_2c0.
                            super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                  set_error(this,&local_1b0,&local_2c0);
                  if (local_2c0.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_2c0.
                               super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                    operator_delete(local_1b0._M_dataplus._M_p);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return bVar6;
}

Assistant:

bool Compiler::read_number(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write)   // p always NULL
{
    if (read_nil_nb(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_forever_nb(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_variable(node, write_index, extent_index, write, NUMBER)) {
        return true;
    }

    if (read_reference(node, write_index, extent_index, write, NUMBER)) {
        return true;
    }

    if (read_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_tail_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (node->cmd != "" && !Utils::StartsWith(node->cmd, "0x") && !Utils::EndsWith(node->cmd, "us")) { // Make sure it isn't a hex num or a timestamp
        std::istringstream stream(node->cmd);
        stream.imbue(std::locale("C"));
        double num;
        stream >> num;
        if (!stream.fail()) {
            if (write) {
                current_object->code[write_index] = Atom::Float(num);
            }
            return true;
        }
    }

    State s = save_state();

    if (expression(node, NUMBER, write_index, extent_index, write)) {
        return true;
    }

    restore_state(s);

    if (enforce) {
        set_error(" error: expected a number or an expr evaluating to a number, got: " + node->cmd, node);
        return false;
    }

    return false;
}